

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForExtension
          (Generator *this,GeneratorOptions *options,FieldDescriptor *field,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  FieldDescriptor *this_01;
  bool bVar1;
  Descriptor *this_02;
  string *__lhs;
  GeneratorOptions *options_00;
  string local_50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *forwards_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *required_local;
  FieldDescriptor *field_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_30 = forwards;
  forwards_local = required;
  required_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)field;
  field_local = (FieldDescriptor *)options;
  options_local = (GeneratorOptions *)this;
  this_02 = FieldDescriptor::containing_type(field);
  __lhs = Descriptor::full_name_abi_cxx11_(this_02);
  bVar1 = std::operator!=(__lhs,"google.protobuf.bridge.MessageSet");
  this_01 = field_local;
  this_00 = forwards_local;
  if (bVar1) {
    options_00 = (GeneratorOptions *)
                 FieldDescriptor::containing_type((FieldDescriptor *)required_local);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)this_01,options_00,(Descriptor *)required);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  FindRequiresForField
            (this,(GeneratorOptions *)field_local,(FieldDescriptor *)required_local,forwards_local,
             local_30);
  return;
}

Assistant:

void Generator::FindRequiresForExtension(const GeneratorOptions& options,
                                         const FieldDescriptor* field,
                                         std::set<string>* required,
                                         std::set<string>* forwards) const {
    if (field->containing_type()->full_name() != "google.protobuf.bridge.MessageSet") {
      required->insert(GetMessagePath(options, field->containing_type()));
    }
    FindRequiresForField(options, field, required, forwards);
}